

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsencoding.h
# Opt level: O1

uint32_t * __thiscall
vsencoding::VSEncoding::compute_OptPartition
          (VSEncoding *this,uint32_t *seq,uint32_t len,uint32_t fixCost,uint32_t *pSize)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t *puVar3;
  uint uVar4;
  uint uVar5;
  uint32_t uVar6;
  void *__s;
  void *__s_00;
  ulong uVar7;
  uint32_t *puVar8;
  uint uVar9;
  uint uVar10;
  uint32_t uVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  
  __s = operator_new__((ulong)(len + 1) * 4);
  __s_00 = operator_new__((ulong)(len + 1) << 3);
  uVar5 = len + 1;
  if (uVar5 != 0) {
    memset(__s,0xff,(ulong)uVar5 * 4);
    memset(__s_00,0,(ulong)uVar5 << 3);
  }
  if (len == 0) {
    uVar5 = 0;
  }
  else {
    uVar6 = this->maxBlk;
    puVar8 = this->posszLens;
    puVar3 = this->possLens;
    uVar2 = this->poss_sz;
    bVar1 = this->aligned;
    uVar5 = 0;
    do {
      uVar15 = uVar5 + 1;
      uVar16 = uVar15 - uVar6;
      uVar10 = ~((int)uVar16 >> 0x1f) & uVar16;
      if ((int)uVar10 <= (int)uVar5) {
        lVar17 = (long)(int)uVar5 + 1;
        uVar7 = (ulong)uVar15;
        uVar9 = 0;
        uVar11 = 1;
        iVar12 = 0;
        iVar13 = 0;
        do {
          uVar4 = seq[lVar17 + -1];
          if (seq[lVar17 + -1] < uVar9) {
            uVar4 = uVar9;
          }
          uVar9 = uVar4;
          if (puVar8 == (uint32_t *)0x0) {
LAB_0010ce43:
            if (uVar11 == puVar3[iVar12]) {
              iVar12 = iVar12 + 1;
LAB_0010ce4b:
              uVar4 = uVar9 * uVar11 + 0x1f >> 5;
              if ((bVar1 & 1U) == 0) {
                uVar4 = uVar9 * uVar11;
              }
              uVar14 = (ulong)uVar4 + (ulong)fixCost + *(long *)((long)__s_00 + lVar17 * 8 + -8);
              if (*(int *)((long)__s + uVar7 * 4) == -1) {
                *(ulong *)((long)__s_00 + uVar7 * 8) = uVar14 + 1;
              }
              if (uVar14 <= *(ulong *)((long)__s_00 + uVar7 * 8)) {
                *(ulong *)((long)__s_00 + uVar7 * 8) = uVar14;
                *(uint *)((long)__s + uVar7 * 4) = uVar5;
              }
            }
          }
          else {
            if (uVar9 != 0) {
              if ((int)uVar16 < 1) {
                uVar10 = 0;
              }
              else {
                uVar10 = uVar15 - puVar3[uVar2 - 1];
              }
              goto LAB_0010ce43;
            }
            iVar12 = iVar12 + (uint)(uVar11 == puVar3[iVar12]);
            if (uVar11 == puVar8[iVar13]) {
              iVar13 = iVar13 + 1;
              goto LAB_0010ce4b;
            }
          }
          uVar11 = uVar11 + 1;
          lVar17 = lVar17 + -1;
          uVar5 = uVar5 - 1;
        } while ((int)uVar10 < lVar17);
      }
      uVar5 = uVar15;
    } while (uVar15 != len);
    uVar5 = 0;
    uVar6 = len;
    do {
      uVar6 = *(uint32_t *)((long)__s + (long)(int)uVar6 * 4);
      uVar5 = uVar5 + 1;
    } while (uVar6 != 0);
  }
  *pSize = uVar5;
  puVar8 = (uint32_t *)operator_new__((ulong)(uVar5 + 1) << 2);
  for (; len != 0; len = *(uint32_t *)((long)__s + (long)(int)len * 4)) {
    uVar7 = (ulong)uVar5;
    uVar5 = uVar5 - 1;
    puVar8[uVar7] = len;
  }
  *puVar8 = 0;
  operator_delete__(__s);
  operator_delete__(__s_00);
  return puVar8;
}

Assistant:

inline uint32_t *VSEncoding::compute_OptPartition(uint32_t *seq, uint32_t len,
                                           uint32_t fixCost, uint32_t &pSize) {
  int *SSSP;
  uint32_t i;
  uint32_t maxB;
  uint32_t *part;
  uint64_t curCost;
  uint64_t *cost;

  /* It will store the shortest path */
  SSSP = new int[len + 1];

  /* cost[i] will contain the cost of encoding up to i-th position */
  cost = new uint64_t[len + 1];

  if (SSSP == NULL || cost == NULL)
    fprintf(stderr, "Can't allocate memory\n");

  for (i = 0; i < len + 1U; ++i) {
    SSSP[i] = -1;
    cost[i] = 0;
  }

  /*
   * This loop computes the cost of the optimal partition.
   * The computation of the max log in each block is done
   * by scanning. Probably we could obtain a faster solution
   * by using RMQ data structures. We use this trivial
   * solution since construction time is not our main concern.
   */
  {
    int mleft;
    int j;
    int g;
    int l;

    for (i = 0U; i < len;) {
      ++i; // rewrite to avoid possibly infinite loop warning
      mleft = (static_cast<int>(i - maxBlk) > 0) ? i - maxBlk : 0;

      for (maxB = 0, l = 0, g = 0, j = i - 1; j >= mleft; j--) {
        if (maxB < seq[j])
          maxB = seq[j];

        if (posszLens == NULL) {
          /*
           * FIXME: If the gaps of elements in possLens[] are
           * sparse, a process below is more efficient to hop
           * these gaps using the elements rather than
           * decrementing j.
           */
          if (i - j != possLens[l])
            continue;
          else
            l++;
        } else {
          /*
           * Treat runs of 0 in a different way.
           * They could form larger blocks!
           */
          if (maxB != 0) {
            mleft = (static_cast<int>(i - maxBlk) > 0)
                        ? i - possLens[poss_sz - 1]
                        : 0;

            if (i - j != possLens[l])
              continue;

            if (i - j == possLens[l])
              l++;
          } else {
            if (i - j == possLens[l])
              l++;

            if (i - j != posszLens[g])
              continue;

            if (i - j == posszLens[g])
              g++;
          }
        }

        /* Caluculate costs */
        if (aligned)
          curCost = cost[j] + div_roundup((i - j) * maxB, 32) + fixCost;
        else
          curCost = cost[j] + (i - j) * maxB + fixCost;

        if (SSSP[i] == -1)
          cost[i] = curCost + 1;

        if (curCost <= cost[i]) {
          cost[i] = curCost;
          SSSP[i] = j;
        }
      }
    }
  }

  /* Compute number of nodes in the path */
  {
    int next;

    pSize = 0;
    next = len;

    while (next != 0) {
      next = SSSP[next];
      pSize++;
    }

    /*
     * Obtain the optimal partition starting
     * from the last block.
     */
    part = new uint32_t[pSize + 1];

    if (part == NULL) {
      /* Finalization */
      delete[] SSSP;
      delete[] cost;
      throw std::runtime_error("Can't allocate memory");
    }

    i = pSize;
    next = len;

    while (next != 0) {
      part[i--] = next;
      next = SSSP[next];
    }

    part[0] = 0;
  }

  /* Finalization */
  delete[] SSSP;
  delete[] cost;

  return part;
}